

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Property.h
# Opt level: O2

shared_ptr<const_Rml::FilterDeclarationList> __thiscall
Rml::Property::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>(Property *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<const_Rml::FilterDeclarationList> *in_RSI;
  shared_ptr<const_Rml::FilterDeclarationList> sVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_10;
  
  _Stack_10._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  Variant::Get<std::shared_ptr<Rml::FilterDeclarationList_const>>(&this->value,in_RSI);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_10);
  sVar1.super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = extraout_RDX._M_pi;
  sVar1.super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<const_Rml::FilterDeclarationList>)
         sVar1.super___shared_ptr<const_Rml::FilterDeclarationList,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

T Get() const
	{
		return value.Get<T>();
	}